

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::DataScriptModule<(wabt::ScriptModuleType)1>::~DataScriptModule
          (DataScriptModule<(wabt::ScriptModuleType)1> *this)

{
  DataScriptModule<(wabt::ScriptModuleType)1> *this_local;
  
  ~DataScriptModule(this);
  operator_delete(this);
  return;
}

Assistant:

const Location& location() const override { return loc; }